

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comment.cc
# Opt level: O2

void __thiscall CommentDatabaseInternal::clear(CommentDatabaseInternal *this)

{
  void *pvVar1;
  _Base_ptr p_Var2;
  
  for (p_Var2 = (this->commentset)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->commentset)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    pvVar1 = *(void **)(p_Var2 + 1);
    if (pvVar1 != (void *)0x0) {
      std::__cxx11::string::~string((string *)((long)pvVar1 + 0x30));
    }
    operator_delete(pvVar1);
  }
  std::
  _Rb_tree<Comment_*,_Comment_*,_std::_Identity<Comment_*>,_CommentOrder,_std::allocator<Comment_*>_>
  ::clear(&(this->commentset)._M_t);
  return;
}

Assistant:

void CommentDatabaseInternal::clear(void)

{
  CommentSet::iterator iter;

  for(iter=commentset.begin();iter!=commentset.end();++iter)
    delete *iter;
  commentset.clear();
}